

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O1

void __thiscall
ki::dml::
Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
::Field(Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
        *this,string *name)

{
  pointer pcVar1;
  size_t sVar2;
  string local_60;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_40;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + name->_M_string_length);
  FieldBase::FieldBase(&this->super_FieldBase,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  (this->super_FieldBase).super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_write_to_0018d588;
  (this->m_value)._M_dataplus._M_p = (pointer)&(this->m_value).field_2;
  (this->m_value)._M_string_length = 0;
  (this->m_value).field_2._M_local_buf[0] = L'\0';
  sVar2 = std::type_info::hash_code((type_info *)&std::__cxx11::u16string::typeinfo);
  (this->super_FieldBase).m_type_hash = sVar2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = L'\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  operator=(&this->m_value,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

Field(std::string name) : FieldBase(name)
		{
			m_type_hash = typeid(ValueT).hash_code();
			m_value = ValueT();
		}